

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdUnblindTxOut(void *handle,char *tx_hex_string,uint32_t tx_out_index,char *blinding_key,
                   char **asset,int64_t *value,char **asset_blind_factor,char **value_blind_factor)

{
  bool bVar1;
  char *pcVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  CfdException *pCVar6;
  Amount AVar7;
  allocator local_169;
  char *work_asset_blind_factor;
  char *work_asset;
  undefined1 local_158 [32];
  undefined8 local_138;
  UnblindParameter unblind_data;
  string local_a0;
  ConfidentialTransactionController ctxc;
  
  work_asset = (char *)0x0;
  work_asset_blind_factor = (char *)0x0;
  local_138 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    unblind_data.asset._vptr_ConfidentialAssetId = (_func_int **)0x4fbb12;
    unblind_data.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x793;
    unblind_data.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = "CfdUnblindTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&unblind_data,"tx is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&unblind_data,"Failed to parameter. tx is null or empty.",
               (allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&unblind_data);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(blinding_key);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&unblind_data,tx_hex_string,(allocator *)local_158);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&ctxc,(string *)&unblind_data);
    std::__cxx11::string::~string((string *)&unblind_data);
    std::__cxx11::string::string((string *)&local_a0,blinding_key,&local_169);
    cfd::core::Privkey::Privkey((Privkey *)local_158,&local_a0,kMainnet,true);
    cfd::ConfidentialTransactionController::UnblindTxOut
              (&unblind_data,&ctxc,tx_out_index,(Privkey *)local_158);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&unblind_data.asset);
    if (!bVar1) {
      if (asset == (char **)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_158,&unblind_data.asset);
        pcVar2 = cfd::capi::CreateString((string *)local_158);
        work_asset = pcVar2;
        std::__cxx11::string::~string((string *)local_158);
      }
      if (value != (int64_t *)0x0) {
        AVar7 = cfd::core::ConfidentialValue::GetAmount(&unblind_data.value);
        local_158._0_8_ = AVar7.amount_;
        local_158[8] = AVar7.ignore_check_;
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_158);
        *value = iVar3;
      }
      if (asset_blind_factor == (char **)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_158,&unblind_data.abf);
        pcVar4 = cfd::capi::CreateString((string *)local_158);
        work_asset_blind_factor = pcVar4;
        std::__cxx11::string::~string((string *)local_158);
      }
      if (value_blind_factor == (char **)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_158,&unblind_data.vbf);
        pcVar5 = cfd::capi::CreateString((string *)local_158);
        std::__cxx11::string::~string((string *)local_158);
      }
      if (pcVar2 != (char *)0x0) {
        *asset = pcVar2;
      }
      if (pcVar4 != (char *)0x0) {
        *asset_blind_factor = pcVar4;
      }
      if (pcVar5 != (char *)0x0) {
        *value_blind_factor = pcVar5;
      }
    }
    cfd::core::UnblindParameter::~UnblindParameter(&unblind_data);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  unblind_data.asset._vptr_ConfidentialAssetId = (_func_int **)0x4fbb12;
  unblind_data.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x799;
  unblind_data.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdUnblindTxOut";
  cfd::core::logger::warn<>((CfdSourceLocation *)&unblind_data,"blinding key is null or empty.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&unblind_data,"Failed to parameter. blinding key is null or empty.",
             (allocator *)&ctxc);
  cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&unblind_data);
  __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUnblindTxOut(
    void* handle, const char* tx_hex_string, uint32_t tx_out_index,
    const char* blinding_key, char** asset, int64_t* value,
    char** asset_blind_factor, char** value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(blinding_key)) {
      warn(CFD_LOG_SOURCE, "blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    UnblindParameter unblind_data =
        ctxc.UnblindTxOut(tx_out_index, Privkey(blinding_key));

    if (!unblind_data.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_data.asset.GetHex());
      }
      if (value != nullptr) {
        *value = unblind_data.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_data.abf.GetHex());
      }
      if (value_blind_factor != nullptr) {
        work_value_blind_factor = CreateString(unblind_data.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}